

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 03_signal_epoll.c
# Opt level: O0

void setup_signals(int argc,char **argv)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  long alarm_after;
  sigaction sa;
  char **argv_local;
  int argc_local;
  
  sa.sa_restorer = (_func_void *)argv;
  if (argc < 2) {
    printf("No alarm set. Will not be interrupted.\n");
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0;
    lVar3 = strtol(*(char **)(sa.sa_restorer + 8),(char **)0x0,10);
    piVar2 = __errno_location();
    if (*piVar2 != 0) {
      perror("strtol()");
      exit(1);
    }
    if (lVar3 == 0) {
      printf("No alarm set. Will not be interrupted.\n");
    }
    else {
      printf("Alarm after %ld seconds.\n",lVar3);
      sigemptyset((sigset_t *)&sa);
      sa.sa_mask.__val[0xf]._0_4_ = 0x10000000;
      alarm_after = (long)sigalrm_handler;
      iVar1 = sigaction(0xe,(sigaction *)&alarm_after,(sigaction *)0x0);
      if (iVar1 == -1) {
        perror("sigaction");
        exit(1);
      }
      alarm((uint)lVar3);
    }
  }
  return;
}

Assistant:

void setup_signals(int argc, char **argv) {
    struct sigaction sa;

    /* No argument passed, and so no signal will be delivered */
    if (argc < 2) {
        printf("No alarm set. Will not be interrupted.\n");
        return;
    }

    /*  if a proper number is passed, we setup the alarm,
     * else we return without setting one up.
     * */
    errno = 0;
    long alarm_after = strtol(argv[1], NULL, 10);
    if (errno)
        handle_error("strtol()");
    if (alarm_after)
        printf("Alarm after %ld seconds.\n", alarm_after);
    else {
        printf("No alarm set. Will not be interrupted.\n");
        return;
    }

    /*
     * Setup a signal handler for the SIGALRM signal
     * */
    sigemptyset(&sa.sa_mask);
    sa.sa_flags = SA_RESTART;
    sa.sa_handler = sigalrm_handler;
    if (sigaction(SIGALRM, &sa, NULL) == -1)
        handle_error("sigaction");

    /*
     * Let's send ourselves a SIGALRM signal specified
     * seconds later.
     * */
    alarm(alarm_after);
}